

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

int __thiscall branch_and_reduce_algorithm::cycleLowerBound(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  int *piVar8;
  bool bVar9;
  ulong uVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  pointer piVar14;
  int *piVar15;
  uint uVar16;
  long lVar17;
  pointer piVar18;
  pointer piVar19;
  pointer piVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  pointer piVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  pointer piVar30;
  uint local_d0;
  uint local_bc;
  pointer local_b8;
  
  iVar22 = this->n;
  local_d0 = this->crt;
  if (0 < iVar22) {
    piVar20 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      piVar20[lVar17] = -1;
      lVar17 = lVar17 + 1;
      iVar22 = this->n;
    } while (lVar17 < iVar22);
    if (0 < iVar22) {
      piVar20 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar3 = (this->adj).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar26 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_b8 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      piVar19 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      piVar14 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      uVar28 = 0;
LAB_0010a9a4:
      if ((piVar4[uVar28] < 0) && (piVar5[uVar28] < 0)) {
        piVar6 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar18 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar24 = uVar28 & 0xffffffff;
        uVar29 = 0;
        do {
          uVar12 = uVar29;
          iVar22 = (int)uVar24;
          if (-1 < piVar5[iVar22]) {
            __assert_fail("id[v] < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                          ,0x1c1,"int branch_and_reduce_algorithm::cycleLowerBound()");
          }
          piVar5[iVar22] = (int)uVar28;
          uVar1 = piVar6[iVar22];
          uVar24 = (ulong)uVar1;
          piVar7[(int)uVar1] = (int)uVar12;
          piVar18[uVar12] = uVar1;
          uVar29 = uVar12 + 1;
        } while (uVar28 != uVar24);
        uVar24 = 0;
        do {
          iVar22 = piVar18[uVar24];
          iVar25 = 0;
          for (piVar15 = pvVar3[iVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              piVar15 !=
              *(pointer *)
               ((long)&pvVar3[iVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data + 8); piVar15 = piVar15 + 1) {
            if (piVar4[*piVar15] < 0) {
              iVar25 = iVar25 + (uint)(piVar5[*piVar15] == piVar5[iVar22]);
            }
          }
          if (iVar25 + 1 != (int)uVar29) {
            uVar1 = local_d0;
            if (uVar12 < 5) goto LAB_0010ae01;
            uVar24 = uVar29 & 0xffffffff;
            piVar6 = piVar20;
            piVar18 = piVar26;
            piVar11 = local_b8;
            piVar20 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            goto LAB_0010aab8;
          }
          uVar24 = uVar24 + 1;
        } while (uVar29 != uVar24);
        local_d0 = local_d0 + (int)uVar29 + -1;
      }
      goto LAB_0010ae28;
    }
  }
  piVar26 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
LAB_0010ae4d:
  piVar20 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (iVar22 * 2 != (int)((ulong)((long)piVar26 - (long)piVar20) >> 2)) {
    piVar4 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    piVar5 = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar5;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar20;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar26;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar4;
  }
  return local_d0;
  while( true ) {
    uVar24 = 0;
    if (local_d0 != local_bc) {
      uVar24 = 0;
      uVar16 = local_d0;
      do {
        piVar20[uVar24] = piVar30[(int)uVar16];
        uVar24 = uVar24 + 1;
        uVar16 = (int)(uVar16 + 1) % iVar22;
      } while (uVar16 != local_bc);
      if (local_d0 != local_bc) {
        iVar23 = this->n;
        do {
          piVar5[piVar30[(int)local_bc]] = iVar23;
          local_bc = (int)(local_bc + 1) % iVar22;
        } while (local_bc != local_d0);
      }
    }
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar20;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar18;
    (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar11;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar30;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar26;
    (this->modTmp).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_b8;
    iVar23 = (int)uVar24;
    if (iVar22 - iVar25 != iVar23) {
      __assert_fail("size == p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                    ,0x206,"int branch_and_reduce_algorithm::cycleLowerBound()");
    }
    if (iVar25 < 2) {
      __assert_fail("minSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                    ,0x207,"int branch_and_reduce_algorithm::cycleLowerBound()");
    }
    if (iVar23 < 1) goto LAB_0010aece;
    local_d0 = (iVar25 + 1U >> 1) + uVar1;
    uVar29 = 0;
    do {
      piVar7[piVar20[uVar29]] = (int)uVar29;
      uVar29 = uVar29 + 1;
    } while ((uVar24 & 0xffffffff) != uVar29);
    piVar14 = local_b8;
    piVar19 = piVar26;
    piVar6 = piVar30;
    if (iVar23 < 6) break;
LAB_0010aab8:
    piVar30 = piVar20;
    local_b8 = piVar11;
    piVar26 = piVar18;
    piVar20 = piVar6;
    piVar18 = piVar19;
    piVar11 = piVar14;
    uVar1 = local_d0;
    iVar22 = (int)uVar24;
    uVar29 = uVar24 & 0xffffffff;
    piVar19 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar14 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar12 = 1;
    if (1 < iVar22) {
      uVar12 = uVar24 & 0xffffffff;
    }
    iVar25 = (this->used).uid;
    uVar24 = uVar24 & 0xffffffff;
    local_bc = 0;
    uVar27 = 0;
    uVar21 = uVar29;
    do {
      (this->used).uid = iVar25 + 1;
      bVar9 = iVar25 < -1;
      iVar25 = iVar25 + 1;
      if (bVar9) {
        if (piVar14 != piVar19) {
          uVar13 = 0;
          do {
            piVar19[uVar13] = 0;
            uVar13 = uVar13 + 1;
          } while ((uVar13 & 0xffffffff) < (ulong)((long)piVar14 - (long)piVar19 >> 2));
        }
        (this->used).uid = 1;
        iVar25 = 1;
      }
      local_d0 = (uint)uVar24;
      iVar23 = piVar30[uVar27];
      piVar15 = pvVar3[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = *(pointer *)
                ((long)&pvVar3[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar15 != piVar8) {
        piVar6 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar2 = *piVar15;
          if ((piVar4[iVar2] < 0) && (piVar5[iVar2] == piVar5[iVar23])) {
            piVar6[iVar2] = iVar25;
          }
          piVar15 = piVar15 + 1;
        } while (piVar15 != piVar8);
      }
      uVar13 = uVar27 + 1;
      uVar24 = (uVar13 & 0xffffffff) % uVar29;
      iVar23 = piVar30[uVar24];
      piVar15 = pvVar3[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = *(pointer *)
                ((long)&pvVar3[iVar23].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (piVar15 != piVar8) {
        iVar25 = (this->used).uid;
        do {
          iVar2 = *piVar15;
          if ((piVar4[iVar2] < 0) && (piVar5[iVar2] == piVar5[iVar23])) {
            uVar16 = (piVar7[iVar2] + 1) % iVar22;
            if (((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar30[(int)uVar16]] == iVar25) &&
               ((uVar10 = (long)(piVar7[iVar2] + (iVar22 - (int)uVar27)) % (long)iVar22,
                (int)uVar10 < (int)uVar21 && ((uVar10 & 1) != 0)))) {
              uVar21 = uVar10 & 0xffffffff;
              local_bc = (uint)uVar24;
              local_d0 = uVar16;
            }
          }
          piVar15 = piVar15 + 1;
        } while (piVar15 != piVar8);
      }
      uVar24 = (ulong)local_d0;
      uVar27 = uVar13;
    } while (uVar13 != uVar12);
    iVar25 = (int)uVar21;
    piVar14 = piVar11;
    piVar19 = piVar18;
    if (iVar22 == iVar25) goto LAB_0010ae01;
  }
  uVar29 = uVar24 & 0xffffffff;
  piVar20 = piVar30;
  piVar26 = piVar18;
  local_b8 = piVar11;
  uVar1 = local_d0;
LAB_0010ae01:
  local_d0 = uVar1;
  if ((int)uVar29 < 2) {
LAB_0010aece:
    __assert_fail("size > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                  ,0x20c,"int branch_and_reduce_algorithm::cycleLowerBound()");
  }
  local_d0 = ((int)uVar29 + 1U >> 1) + local_d0;
LAB_0010ae28:
  uVar28 = uVar28 + 1;
  iVar22 = this->n;
  if ((long)iVar22 <= (long)uVar28) goto LAB_0010ae4d;
  goto LAB_0010a9a4;
}

Assistant:

int branch_and_reduce_algorithm::cycleLowerBound()
{
    int lb = crt;
    std::vector<int> &id = iter;
    for (int i = 0; i < n; i++)
        id[i] = -1;
    std::vector<int> &pos = que;
    std::vector<int> &S = level;
    std::vector<int> &S2 = modTmp;
    for (int i = 0; i < n; i++)
        if (x[i] < 0 && id[i] < 0)
        {
            int v = i;
            int size = 0;
            do
            {
                assert(id[v] < 0);
                id[v] = i;
                v = out[v];
                pos[v] = size;
                S[size++] = v;
            } while (v != i);
            bool clique = true;
            for (int j = 0; j < size; j++)
            {
                v = S[j];
                int num = 0;
                for (int u : adj[v])
                    if (x[u] < 0 && id[u] == id[v])
                        num++;
                if (num != size - 1)
                {
                    clique = false;
                    break;
                }
            }
            if (clique)
            {
                lb += size - 1;
            }
            else
            {
                while (size >= 6)
                {
                    int minSize = size, s = 0, t = size;
                    for (int j = 0; j < size; j++)
                    {
                        used.clear();
                        v = S[j];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                used.add(u);
                            }
                        v = S[(j + 1) % size];
                        for (int u : adj[v])
                            if (x[u] < 0 && id[u] == id[v])
                            {
                                if (used.get(S[(pos[u] + 1) % size]))
                                {
                                    int size2 = (pos[u] - j + size) % size;
                                    if (minSize > size2 && size2 % 2 != 0)
                                    {
                                        minSize = size2;
                                        s = (j + 1) % size;
                                        t = (pos[u] + 1) % size;
                                    }
                                }
                            }
                    }
                    if (minSize == size)
                        break;
                    int p = 0;
                    for (int j = t; j != s; j = (j + 1) % size)
                    {
                        S2[p++] = S[j];
                    }
                    for (int j = s; j != t; j = (j + 1) % size)
                    {
                        id[S[j]] = n;
                    }

                    S.swap(S2);

                    size -= minSize;
                    assert(size == p);
                    assert(minSize > 1);
                    lb += (minSize + 1) / 2;
                    for (int j = 0; j < size; j++)
                        pos[S[j]] = j;
                }
                assert(size > 1);
                lb += (size + 1) / 2;
            }
        }

    if (static_cast<int>(level.size()) != n * 2)
    {
        level.swap(modTmp);
    }
    return lb;
}